

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

void __thiscall
wallet::CWallet::WalletLogPrintf<unsigned_int,unsigned_char,std::__cxx11::string>
          (CWallet *this,char *fmt,uint parameters,uchar parameters_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  uchar *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  allocator<char> local_12a;
  uchar parameters_local_1;
  uint parameters_local;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [4];
  string local_60;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parameters_local_1 = parameters_1;
  parameters_local = parameters;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,fmt,&local_12a);
  std::operator+(local_e0,"%s ",&local_100);
  GetDisplayName_abi_cxx11_(&local_120,this);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<std::__cxx11::string,unsigned_int,unsigned_char,std::__cxx11::string>
              (&local_60,(tinyformat *)local_e0[0]._M_dataplus._M_p,(char *)&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parameters_local,(uint *)&parameters_local_1,in_R8,in_stack_fffffffffffffea8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pLVar3 = LogInstance();
    local_60._M_dataplus._M_p = &DAT_00000058;
    local_60._M_string_length = 0xc902cd;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_len = 0x58;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x3a4,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), GetDisplayName(), parameters...);
    }